

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

bool remap_generic(Compiler *compiler,SmallVector<spirv_cross::Resource,_8UL> *resources,
                  Remap *remap)

{
  void *__s2;
  size_t __n;
  long lVar1;
  int iVar2;
  undefined8 *in_RCX;
  long lVar3;
  long lVar4;
  SmallVector<spirv_cross::Resource,_8UL> *pSVar5;
  
  lVar1 = (long)remap * 0x30;
  __s2 = (void *)*in_RCX;
  __n = in_RCX[1];
  lVar3 = (long)remap >> 2;
  pSVar5 = resources;
  if (0 < lVar3) {
    lVar4 = lVar3 + 1;
    pSVar5 = (SmallVector<spirv_cross::Resource,_8UL> *)
             ((resources->stack_storage).aligned_char + 0x48);
    do {
      if (*(size_t *)(pSVar5[-1].stack_storage.aligned_char + 0x138) == __n) {
        if ((__n == 0) ||
           (iVar2 = bcmp(*(void **)(pSVar5[-1].stack_storage.aligned_char + 0x130),__s2,__n),
           iVar2 == 0)) {
          pSVar5 = (SmallVector<spirv_cross::Resource,_8UL> *)
                   (pSVar5[-1].stack_storage.aligned_char + 0x120);
          goto LAB_00116c29;
        }
        if (*(size_t *)(pSVar5[-1].stack_storage.aligned_char + 0x168) == __n) goto LAB_00116af7;
      }
      else if (*(size_t *)(pSVar5[-1].stack_storage.aligned_char + 0x168) == __n) {
        if (__n != 0) {
LAB_00116af7:
          iVar2 = bcmp(*(void **)(pSVar5[-1].stack_storage.aligned_char + 0x160),__s2,__n);
          if (iVar2 != 0) goto LAB_00116b0e;
        }
        pSVar5 = (SmallVector<spirv_cross::Resource,_8UL> *)
                 (pSVar5[-1].stack_storage.aligned_char + 0x150);
        goto LAB_00116c29;
      }
LAB_00116b0e:
      if (*(size_t *)(pSVar5->stack_storage).aligned_char == __n) {
        if ((__n == 0) || (iVar2 = bcmp((void *)pSVar5->buffer_capacity,__s2,__n), iVar2 == 0))
        goto LAB_00116c29;
        if (*(size_t *)((pSVar5->stack_storage).aligned_char + 0x30) == __n) {
LAB_00116b4b:
          iVar2 = bcmp(*(void **)((pSVar5->stack_storage).aligned_char + 0x28),__s2,__n);
          if (iVar2 == 0) goto LAB_00116c1d;
        }
      }
      else if (*(size_t *)((pSVar5->stack_storage).aligned_char + 0x30) == __n) {
        if (__n != 0) goto LAB_00116b4b;
LAB_00116c1d:
        pSVar5 = (SmallVector<spirv_cross::Resource,_8UL> *)
                 ((pSVar5->stack_storage).aligned_char + 0x18);
        goto LAB_00116c29;
      }
      lVar4 = lVar4 + -1;
      pSVar5 = (SmallVector<spirv_cross::Resource,_8UL> *)
               ((pSVar5->stack_storage).aligned_char + 0xa8);
    } while (1 < lVar4);
    remap = (Remap *)((lVar1 + lVar3 * -0xc0 >> 4) * -0x5555555555555555);
    pSVar5 = (SmallVector<spirv_cross::Resource,_8UL> *)
             ((resources->stack_storage).aligned_char + lVar3 * 0xc0 + -0x18);
  }
  if (remap != (Remap *)0x1) {
    if (remap != (Remap *)0x2) {
      if (remap != (Remap *)0x3) {
        return false;
      }
      if ((*(size_t *)(pSVar5->stack_storage).aligned_char == __n) &&
         ((__n == 0 || (iVar2 = bcmp((void *)pSVar5->buffer_capacity,__s2,__n), iVar2 == 0))))
      goto LAB_00116c29;
      pSVar5 = (SmallVector<spirv_cross::Resource,_8UL> *)
               ((pSVar5->stack_storage).aligned_char + 0x18);
    }
    if ((*(size_t *)(pSVar5->stack_storage).aligned_char == __n) &&
       ((__n == 0 || (iVar2 = bcmp((void *)pSVar5->buffer_capacity,__s2,__n), iVar2 == 0))))
    goto LAB_00116c29;
    pSVar5 = (SmallVector<spirv_cross::Resource,_8UL> *)
             ((pSVar5->stack_storage).aligned_char + 0x18);
  }
  if (*(size_t *)(pSVar5->stack_storage).aligned_char != __n) {
    return false;
  }
  if ((__n != 0) && (iVar2 = bcmp((void *)pSVar5->buffer_capacity,__s2,__n), iVar2 != 0)) {
    return false;
  }
LAB_00116c29:
  if (pSVar5 == (SmallVector<spirv_cross::Resource,_8UL> *)
                ((resources->stack_storage).aligned_char + lVar1 + -0x18)) {
    return false;
  }
  spirv_cross::Compiler::set_remapped_variable_state
            (compiler,(VariableID)
                      *(uint32_t *)&(pSVar5->super_VectorView<spirv_cross::Resource>).ptr,true);
  spirv_cross::Compiler::set_name
            (compiler,(ID)*(uint32_t *)&(pSVar5->super_VectorView<spirv_cross::Resource>).ptr,
             (string *)(in_RCX + 4));
  spirv_cross::Compiler::set_subpass_input_remapped_components
            (compiler,(VariableID)
                      *(uint32_t *)&(pSVar5->super_VectorView<spirv_cross::Resource>).ptr,
             *(uint32_t *)(in_RCX + 8));
  return true;
}

Assistant:

static bool remap_generic(Compiler &compiler, const SmallVector<Resource> &resources, const Remap &remap)
{
	auto itr =
	    find_if(begin(resources), end(resources), [&remap](const Resource &res) { return res.name == remap.src_name; });

	if (itr != end(resources))
	{
		compiler.set_remapped_variable_state(itr->id, true);
		compiler.set_name(itr->id, remap.dst_name);
		compiler.set_subpass_input_remapped_components(itr->id, remap.components);
		return true;
	}
	else
		return false;
}